

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_decoder_init_custom__internal(ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  bool bVar1;
  ma_result mVar2;
  ma_result mVar3;
  ma_result mVar4;
  ma_result unaff_EBP;
  ulong uVar5;
  
  mVar4 = MA_NO_BACKEND;
  mVar2 = mVar4;
  if ((pConfig->ppCustomBackendVTables != (ma_decoding_backend_vtable **)0x0) &&
     (pConfig->customBackendCount != 0)) {
    uVar5 = 0;
    do {
      if (pConfig->ppCustomBackendVTables[uVar5] == (ma_decoding_backend_vtable *)0x0) {
LAB_00171136:
        mVar3 = unaff_EBP;
        bVar1 = true;
      }
      else {
        mVar2 = ma_decoder_init_from_vtable__internal
                          (pConfig->ppCustomBackendVTables[uVar5],pConfig->pCustomBackendUserData,
                           pConfig,pDecoder);
        bVar1 = false;
        if (mVar2 == MA_SUCCESS) {
          mVar3 = MA_SUCCESS;
          bVar1 = false;
        }
        else {
          mVar3 = (*pDecoder->onSeek)(pDecoder,0,ma_seek_origin_start);
          if (mVar3 == MA_SUCCESS) goto LAB_00171136;
        }
      }
      mVar2 = mVar3;
    } while ((bVar1) &&
            (uVar5 = uVar5 + 1, mVar2 = mVar4, unaff_EBP = mVar3,
            uVar5 < pConfig->customBackendCount));
  }
  return mVar2;
}

Assistant:

static ma_result ma_decoder_init_custom__internal(const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result = MA_NO_BACKEND;
    size_t ivtable;

    MA_ASSERT(pConfig != NULL);
    MA_ASSERT(pDecoder != NULL);

    if (pConfig->ppCustomBackendVTables == NULL) {
        return MA_NO_BACKEND;
    }

    /* The order each backend is listed is what defines the priority. */
    for (ivtable = 0; ivtable < pConfig->customBackendCount; ivtable += 1) {
        const ma_decoding_backend_vtable* pVTable = pConfig->ppCustomBackendVTables[ivtable];
        if (pVTable != NULL) {
            result = ma_decoder_init_from_vtable__internal(pVTable, pConfig->pCustomBackendUserData, pConfig, pDecoder);
            if (result == MA_SUCCESS) {
                return MA_SUCCESS;
            } else {
                /* Initialization failed. Move on to the next one, but seek back to the start first so the next vtable starts from the first byte of the file. */
                result = ma_decoder_seek_bytes(pDecoder, 0, ma_seek_origin_start);
                if (result != MA_SUCCESS) {
                    return result;  /* Failed to seek back to the start. */
                }
            }
        } else {
            /* No vtable. */
        }
    }

    /* Getting here means we couldn't find a backend. */
    return MA_NO_BACKEND;
}